

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

Sign __thiscall
anon_unknown.dwarf_5292d::side3h_2d_exact_SOS
          (anon_unknown_dwarf_5292d *this,double *p0,double *p1,double *p2,double *p3,double h0,
          double h1,double h2,double h3,bool sos)

{
  double dVar1;
  double dVar2;
  long lVar3;
  allocator *paVar4;
  index_t iVar5;
  int iVar6;
  size_t sVar7;
  expansion *peVar8;
  expansion *peVar9;
  expansion *peVar10;
  expansion *b;
  expansion *peVar11;
  expansion *peVar12;
  uchar *sig;
  uchar *sig_00;
  uchar *extraout_RDX;
  uchar *sig_01;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *sig_02;
  expansion *peVar13;
  undefined7 in_register_00000089;
  double dStack_240;
  expansion eStack_238;
  expansion *local_220;
  expansion *local_218;
  expansion *local_210;
  expansion *local_208;
  allocator *local_200;
  allocator *local_1f8;
  expansion *local_1f0;
  expansion *local_1e8;
  expansion *local_1e0;
  expansion *local_1d8;
  expansion *local_1d0;
  expansion *local_1c8;
  expansion *local_1c0;
  expansion *local_1b8;
  expansion *local_1b0;
  expansion *local_1a8;
  expansion *local_1a0;
  expansion *local_198;
  undefined4 local_18c;
  undefined4 local_188;
  Sign Delta2_sign;
  Sign Delta1_sign;
  Sign z_sign;
  expansion *z;
  expansion *z1;
  double *pdStack_168;
  index_t i;
  double *p_sort [4];
  Sign r_sign;
  expansion *r;
  expansion *r_3;
  expansion *r_2;
  expansion *r_1;
  string local_118 [55];
  allocator local_e1;
  string local_e0 [36];
  int local_bc;
  expansion *peStack_b8;
  Sign Delta3_sign;
  expansion *Delta3;
  expansion *Delta2;
  expansion *Delta1;
  expansion *a33;
  expansion *a32;
  expansion *a31;
  expansion *a23;
  expansion *a22;
  expansion *a21;
  expansion *a13;
  expansion *a12;
  expansion *a11;
  double dStack_50;
  bool sos_local;
  double h3_local;
  double h2_local;
  double h1_local;
  double h0_local;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  a11._7_1_ = (byte)p3 & 1;
  dStack_240 = 9.27845401576944e-318;
  dStack_50 = h3;
  h3_local = h2;
  h2_local = h1;
  h1_local = h0;
  h0_local = (double)p2;
  p3_local = p1;
  p2_local = p0;
  p1_local = (double *)this;
  iVar5 = GEO::expansion::diff_capacity(*p0,*(double *)this);
  dStack_240 = 9.27848860036465e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  lVar3 = -(sVar7 + 0xf & 0xfffffffffffffff0);
  dVar1 = *p2_local;
  dVar2 = *p1_local;
  local_1f0 = (expansion *)((long)&eStack_238 + lVar3);
  *(undefined8 *)((long)&eStack_238 + lVar3 + -8) = 0x1ca813;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_1f0;
  *(undefined8 *)((long)&eStack_238 + lVar3 + -8) = 0x1ca821;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar9 = local_1f0;
  dVar1 = *p2_local;
  dVar2 = *p1_local;
  *(undefined8 *)((long)&eStack_238 + lVar3 + -8) = 0x1ca83d;
  a12 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = p2_local[1];
  dVar2 = p1_local[1];
  *(undefined8 *)((long)&eStack_238 + lVar3 + -8) = 0x1ca858;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  *(undefined8 *)((long)&eStack_238 + lVar3 + -8) = 0x1ca85f;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar8 = (expansion *)(((long)&eStack_238 + lVar3) - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = p2_local[1];
  dVar2 = p1_local[1];
  local_1e8 = peVar8;
  peVar8[-1].x_[1] = 9.27934827458841e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_1e8;
  peVar8[-1].x_[1] = 9.27941744377883e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar9 = local_1e8;
  dVar1 = p2_local[1];
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.27956566347258e-318;
  a13 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar2 = h1_local;
  dVar1 = h2_local;
  peVar8[-1].x_[1] = 9.27965953594529e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar8[-1].x_[1] = 9.2796941205405e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  dVar2 = h1_local;
  dVar1 = h2_local;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_1e0 = peVar8;
  peVar8[-1].x_[1] = 9.27990162811176e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar9 = local_1e0;
  peVar8[-1].x_[1] = 9.27997079730217e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  dVar2 = h1_local;
  dVar1 = h2_local;
  peVar9 = local_1e0;
  peVar8[-1].x_[1] = 9.28007949174426e-318;
  a21 = GEO::expansion::assign_diff(peVar9,dVar2,dVar1);
  dVar1 = *p3_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.28020300815572e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.28023759275093e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = *p3_local;
  dVar2 = *p1_local;
  local_1d8 = peVar8;
  peVar8[-1].x_[1] = 9.28047474426093e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_1d8;
  peVar8[-1].x_[1] = 9.28054391345135e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar9 = local_1d8;
  dVar1 = *p3_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.28068225183219e-318;
  a22 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = p3_local[1];
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.28081564955656e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.28085023415177e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = p3_local[1];
  dVar2 = p1_local[1];
  local_1d0 = peVar8;
  peVar8[-1].x_[1] = 9.28109726697469e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_1d0;
  peVar8[-1].x_[1] = 9.28116643616511e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar9 = local_1d0;
  dVar1 = p3_local[1];
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.28131465585886e-318;
  a23 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar2 = h1_local;
  dVar1 = h3_local;
  peVar8[-1].x_[1] = 9.28140852833157e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar8[-1].x_[1] = 9.28144311292678e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  dVar2 = h1_local;
  dVar1 = h3_local;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_1c8 = peVar8;
  peVar8[-1].x_[1] = 9.28165062049803e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar9 = local_1c8;
  peVar8[-1].x_[1] = 9.28171978968845e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  dVar2 = h1_local;
  dVar1 = h3_local;
  peVar9 = local_1c8;
  peVar8[-1].x_[1] = 9.28182848413054e-318;
  a31 = GEO::expansion::assign_diff(peVar9,dVar2,dVar1);
  dVar1 = *(double *)h0_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.281952000542e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.28198658513721e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = *(double *)h0_local;
  dVar2 = *p1_local;
  local_1c0 = peVar8;
  peVar8[-1].x_[1] = 9.28222373664721e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_1c0;
  peVar8[-1].x_[1] = 9.28229290583763e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar9 = local_1c0;
  dVar1 = *(double *)h0_local;
  dVar2 = *p1_local;
  peVar8[-1].x_[1] = 9.28243124421846e-318;
  a32 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar1 = *(double *)((long)h0_local + 8);
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.28257946391222e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar8[-1].x_[1] = 9.28261404850743e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  dVar1 = *(double *)((long)h0_local + 8);
  dVar2 = p1_local[1];
  local_1b8 = peVar8;
  peVar8[-1].x_[1] = 9.28286108133035e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar1,dVar2);
  peVar9 = local_1b8;
  peVar8[-1].x_[1] = 9.28293025052076e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar9 = local_1b8;
  dVar1 = *(double *)((long)h0_local + 8);
  dVar2 = p1_local[1];
  peVar8[-1].x_[1] = 9.28307847021452e-318;
  a33 = GEO::expansion::assign_diff(peVar9,dVar1,dVar2);
  dVar2 = h1_local;
  dVar1 = dStack_50;
  peVar8[-1].x_[1] = 9.2831871646566e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar8[-1].x_[1] = 9.28322174925181e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  dVar2 = h1_local;
  dVar1 = dStack_50;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_1b0 = peVar8;
  peVar8[-1].x_[1] = 9.28342925682306e-318;
  iVar5 = GEO::expansion::diff_capacity(dVar2,dVar1);
  peVar9 = local_1b0;
  peVar8[-1].x_[1] = 9.28349842601348e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  dVar2 = h1_local;
  dVar1 = dStack_50;
  peVar9 = local_1b0;
  peVar8[-1].x_[1] = 9.28360712045557e-318;
  Delta1 = GEO::expansion::assign_diff(peVar9,dVar2,dVar1);
  peVar12 = a22;
  peVar11 = a23;
  peVar13 = a32;
  peVar9 = a33;
  peVar8[-1].x_[1] = 9.28377510277515e-318;
  iVar5 = GEO::expansion::det2x2_capacity(peVar12,peVar11,peVar13,peVar9);
  peVar8[-1].x_[1] = 9.28380968737036e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar12 = a22;
  peVar11 = a23;
  peVar13 = a32;
  peVar9 = a33;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_1a8 = peVar8;
  peVar8[-1].x_[1] = 9.28407648281912e-318;
  iVar5 = GEO::expansion::det2x2_capacity(peVar12,peVar11,peVar13,peVar9);
  peVar9 = local_1a8;
  peVar8[-1].x_[1] = 9.28414565200953e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar10 = a22;
  peVar12 = a23;
  peVar11 = a32;
  peVar13 = a33;
  peVar9 = local_1a8;
  peVar8[-1].x_[1] = 9.28431363432912e-318;
  Delta2 = GEO::expansion::assign_det2x2(peVar9,peVar10,peVar12,peVar11,peVar13);
  peVar12 = a12;
  peVar11 = a13;
  peVar13 = a32;
  peVar9 = a33;
  peVar8[-1].x_[1] = 9.28448161664871e-318;
  iVar5 = GEO::expansion::det2x2_capacity(peVar12,peVar11,peVar13,peVar9);
  peVar8[-1].x_[1] = 9.28451620124391e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar12 = a12;
  peVar11 = a13;
  peVar13 = a32;
  peVar9 = a33;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_1a0 = peVar8;
  peVar8[-1].x_[1] = 9.28478299669267e-318;
  iVar5 = GEO::expansion::det2x2_capacity(peVar12,peVar11,peVar13,peVar9);
  peVar9 = local_1a0;
  peVar8[-1].x_[1] = 9.28485216588309e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar10 = a12;
  peVar12 = a13;
  peVar11 = a32;
  peVar13 = a33;
  peVar9 = local_1a0;
  peVar8[-1].x_[1] = 9.28502014820267e-318;
  Delta3 = GEO::expansion::assign_det2x2(peVar9,peVar10,peVar12,peVar11,peVar13);
  peVar12 = a12;
  peVar11 = a13;
  peVar13 = a22;
  peVar9 = a23;
  peVar8[-1].x_[1] = 9.28515848658351e-318;
  iVar5 = GEO::expansion::det2x2_capacity(peVar12,peVar11,peVar13,peVar9);
  peVar8[-1].x_[1] = 9.28519307117872e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar12 = a12;
  peVar11 = a13;
  peVar13 = a22;
  peVar9 = a23;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_198 = peVar8;
  peVar8[-1].x_[1] = 9.28543022268872e-318;
  iVar5 = GEO::expansion::det2x2_capacity(peVar12,peVar11,peVar13,peVar9);
  peVar9 = local_198;
  peVar8[-1].x_[1] = 9.28549939187914e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar10 = a12;
  peVar12 = a13;
  peVar11 = a22;
  peVar13 = a23;
  peVar9 = local_198;
  peVar8[-1].x_[1] = 9.28563773025997e-318;
  peVar9 = GEO::expansion::assign_det2x2(peVar9,peVar10,peVar12,peVar11,peVar13);
  peStack_b8 = peVar9;
  peVar8[-1].x_[1] = 9.28573160273268e-318;
  local_bc = GEO::expansion::sign
                       (peVar9,(EVP_PKEY_CTX *)peVar10,sig,(size_t *)peVar11,(uchar *)peVar13,
                        CONCAT71(in_register_00000089,sos));
  peVar11 = a21;
  peVar9 = Delta2;
  if (local_bc == 0) {
    local_1f8 = &local_e1;
    peVar8[-1].x_[1] = 9.2859193476781e-318;
    std::allocator<char>::allocator();
    paVar4 = local_1f8;
    peVar8[-1].x_[1] = 9.28604780474602e-318;
    std::__cxx11::string::string(local_e0,"Delta3_sign != ZERO",paVar4);
    local_200 = (allocator *)((long)&r_1 + 7);
    peVar8[-1].x_[1] = 9.28615155853165e-318;
    std::allocator<char>::allocator();
    paVar4 = local_200;
    peVar8[-1].x_[1] = 9.28628001559957e-318;
    std::__cxx11::string::string
              (local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,paVar4);
    peVar8[-1].x_[1] = (double)&LAB_001cae26;
    GEO::geo_assertion_failed((string *)local_e0,(string *)local_118,0x5066);
  }
  peVar8[-1].x_[1] = 9.28704581735062e-318;
  iVar5 = GEO::expansion::product_capacity(peVar9,peVar11);
  peVar8[-1].x_[1] = 9.28708040194583e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar11 = a21;
  peVar9 = Delta2;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_220 = peVar8;
  peVar8[-1].x_[1] = 9.28729285017354e-318;
  iVar5 = GEO::expansion::product_capacity(peVar9,peVar11);
  peVar9 = local_220;
  peVar8[-1].x_[1] = 9.28736201936396e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar12 = a21;
  peVar11 = Delta2;
  peVar9 = local_220;
  peVar8[-1].x_[1] = 9.2874756544625e-318;
  peVar10 = GEO::expansion::assign_product(peVar9,peVar11,peVar12);
  peVar11 = a31;
  peVar9 = Delta3;
  peVar8[-1].x_[1] = 9.28758928956105e-318;
  iVar5 = GEO::expansion::product_capacity(peVar9,peVar11);
  peVar8[-1].x_[1] = 9.28762387415626e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar11 = a31;
  peVar9 = Delta3;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_218 = peVar8;
  peVar8[-1].x_[1] = 9.28783632238397e-318;
  iVar5 = GEO::expansion::product_capacity(peVar9,peVar11);
  peVar9 = local_218;
  peVar8[-1].x_[1] = 9.28790549157438e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar12 = a31;
  peVar11 = Delta3;
  peVar9 = local_218;
  peVar8[-1].x_[1] = 9.28801912667293e-318;
  peVar9 = GEO::expansion::assign_product(peVar9,peVar11,peVar12);
  peVar8[-1].x_[1] = 9.2880586519246e-318;
  b = GEO::expansion::negate(peVar9);
  peVar11 = Delta1;
  peVar9 = peStack_b8;
  peVar8[-1].x_[1] = 9.28818710899251e-318;
  iVar5 = GEO::expansion::product_capacity(peVar9,peVar11);
  peVar8[-1].x_[1] = 9.28822169358772e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar11 = Delta1;
  peVar9 = peStack_b8;
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_210 = peVar8;
  peVar8[-1].x_[1] = 9.28844896378481e-318;
  iVar5 = GEO::expansion::product_capacity(peVar9,peVar11);
  peVar9 = local_210;
  peVar8[-1].x_[1] = 9.28851813297523e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar12 = Delta1;
  peVar11 = peStack_b8;
  peVar9 = local_210;
  peVar8[-1].x_[1] = 9.28864659004315e-318;
  peVar11 = GEO::expansion::assign_product(peVar9,peVar11,peVar12);
  peVar8[-1].x_[1] = 9.28880963170627e-318;
  iVar5 = GEO::expansion::sum_capacity(peVar10,b,peVar11);
  peVar8[-1].x_[1] = 9.28884421630148e-318;
  sVar7 = GEO::expansion::bytes(iVar5);
  peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
  local_208 = peVar8;
  peVar8[-1].x_[1] = 9.28910607109378e-318;
  iVar5 = GEO::expansion::sum_capacity(peVar10,b,peVar11);
  peVar9 = local_208;
  peVar8[-1].x_[1] = 9.2891752402842e-318;
  GEO::expansion::expansion(peVar9,iVar5);
  peVar9 = local_208;
  peVar8[-1].x_[1] = 9.28933828194732e-318;
  peVar9 = GEO::expansion::assign_sum(peVar9,peVar10,b,peVar11);
  peVar8[-1].x_[1] = 9.28943215442003e-318;
  p_sort[3]._4_4_ =
       GEO::expansion::sign
                 (peVar9,(EVP_PKEY_CTX *)peVar10,sig_00,(size_t *)peVar11,(uchar *)peVar13,
                  CONCAT71(in_register_00000089,sos));
  if (((a11._7_1_ & 1) != 0) && (p_sort[3]._4_4_ == 0)) {
    pdStack_168 = p1_local;
    p_sort[0] = p2_local;
    p_sort[1] = p3_local;
    p_sort[2] = (double *)h0_local;
    peVar9 = (expansion *)(p_sort + 3);
    peVar8[-1].x_[1] = 9.28993116072233e-318;
    SOS_sort(&stack0xfffffffffffffe98,(double **)peVar9,3);
    sig_02 = extraout_RDX;
    for (z1._4_4_ = 0; peVar10 = Delta2, peVar12 = Delta3, z1._4_4_ < 4; z1._4_4_ = z1._4_4_ + 1) {
      if (p_sort[(ulong)z1._4_4_ - 1] == p1_local) {
        peVar8[-1].x_[1] = 9.29025724404859e-318;
        iVar5 = GEO::expansion::diff_capacity(peVar12,peVar10);
        peVar8[-1].x_[1] = 9.2902918286438e-318;
        sVar7 = GEO::expansion::bytes(iVar5);
        peVar11 = Delta2;
        peVar9 = Delta3;
        peVar8 = (expansion *)((long)peVar8 - (sVar7 + 0xf & 0xfffffffffffffff0));
        eStack_238.x_[0] = (double)peVar8;
        peVar8[-1].x_[1] = 9.29051909884089e-318;
        iVar5 = GEO::expansion::diff_capacity(peVar9,peVar11);
        dVar1 = eStack_238.x_[0];
        peVar8[-1].x_[1] = 9.2905882680313e-318;
        GEO::expansion::expansion((expansion *)dVar1,iVar5);
        peVar11 = Delta2;
        peVar9 = Delta3;
        dVar1 = eStack_238.x_[0];
        peVar8[-1].x_[1] = 9.29071672509922e-318;
        peVar11 = GEO::expansion::assign_diff((expansion *)dVar1,peVar9,peVar11);
        peVar9 = peStack_b8;
        z = peVar11;
        peVar8[-1].x_[1] = 9.29084518216714e-318;
        iVar5 = GEO::expansion::sum_capacity(peVar11,peVar9);
        peVar8[-1].x_[1] = 9.29087976676235e-318;
        sVar7 = GEO::expansion::bytes(iVar5);
        peVar12 = peStack_b8;
        peVar9 = z;
        peVar11 = (expansion *)(sVar7 + 0xf & 0xfffffffffffffff0);
        peVar8 = (expansion *)((long)peVar8 - (long)peVar11);
        eStack_238.x_[1] = (double)peVar8;
        peVar8[-1].x_[1] = 9.29110703695944e-318;
        iVar5 = GEO::expansion::sum_capacity(peVar9,peVar12);
        dVar1 = eStack_238.x_[1];
        peVar8[-1].x_[1] = 9.29117620614985e-318;
        GEO::expansion::expansion((expansion *)dVar1,iVar5);
        peVar12 = peStack_b8;
        peVar9 = z;
        dVar1 = eStack_238.x_[1];
        peVar8[-1].x_[1] = 9.29130466321777e-318;
        peVar12 = GEO::expansion::assign_sum((expansion *)dVar1,peVar9,peVar12);
        _Delta1_sign = peVar12;
        peVar8[-1].x_[1] = 9.29139853569048e-318;
        iVar6 = GEO::expansion::sign
                          (peVar12,(EVP_PKEY_CTX *)peVar9,sig_01,(size_t *)peVar11,(uchar *)peVar13,
                           CONCAT71(in_register_00000089,sos));
        if (iVar6 != 0) {
          return local_bc * iVar6;
        }
        Delta2_sign = ZERO;
        sig_02 = extraout_RDX_00;
      }
      else if (p_sort[(ulong)z1._4_4_ - 1] == p2_local) {
        peVar8[-1].x_[1] = 9.29175920361195e-318;
        iVar6 = GEO::expansion::sign
                          (peVar10,(EVP_PKEY_CTX *)peVar9,sig_02,(size_t *)peVar11,(uchar *)peVar13,
                           CONCAT71(in_register_00000089,sos));
        if (iVar6 != 0) {
          return local_bc * iVar6;
        }
        local_188 = 0;
        sig_02 = extraout_RDX_01;
      }
      else if (p_sort[(ulong)z1._4_4_ - 1] == p3_local) {
        peVar8[-1].x_[1] = 9.29210504956404e-318;
        iVar6 = GEO::expansion::sign
                          (peVar12,(EVP_PKEY_CTX *)peVar9,sig_02,(size_t *)peVar11,(uchar *)peVar13,
                           CONCAT71(in_register_00000089,sos));
        if (iVar6 != 0) {
          return -local_bc * iVar6;
        }
        local_18c = 0;
        sig_02 = extraout_RDX_02;
      }
      else if (p_sort[(ulong)z1._4_4_ - 1] == (double *)h0_local) {
        return NEGATIVE;
      }
    }
  }
  return local_bc * p_sort[3]._4_4_;
}

Assistant:

Sign side3h_2d_exact_SOS(
        const double* p0, const double* p1,
	const double* p2, const double* p3, 
        double h0, double h1, double h2, double h3,
        bool sos = true
    ) {

        const expansion& a11 = expansion_diff(p1[0], p0[0]);
        const expansion& a12 = expansion_diff(p1[1], p0[1]);
        const expansion& a13 = expansion_diff(h0,h1);

        const expansion& a21 = expansion_diff(p2[0], p0[0]);
        const expansion& a22 = expansion_diff(p2[1], p0[1]);
        const expansion& a23 = expansion_diff(h0,h2);

        const expansion& a31 = expansion_diff(p3[0], p0[0]);
        const expansion& a32 = expansion_diff(p3[1], p0[1]);
        const expansion& a33 = expansion_diff(h0,h3);

        const expansion& Delta1 = expansion_det2x2(
            a21, a22, 
            a31, a32
        );
        const expansion& Delta2 = expansion_det2x2(
            a11, a12,
            a31, a32
        );
        const expansion& Delta3 = expansion_det2x2(
            a11, a12,
            a21, a22
        );

        Sign Delta3_sign = Delta3.sign();
        geo_assert(Delta3_sign != ZERO);

        const expansion& r_1 = expansion_product(Delta1, a13);
        const expansion& r_2 = expansion_product(Delta2, a23).negate();
        const expansion& r_3 = expansion_product(Delta3, a33);
        const expansion& r = expansion_sum3(r_1, r_2, r_3);

        Sign r_sign = r.sign();

        // Simulation of Simplicity (symbolic perturbation)
        if(sos && r_sign == ZERO) {
            const double* p_sort[4];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            SOS_sort(p_sort, p_sort + 4, 3);
            for(index_t i = 0; i < 4; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1 = expansion_diff(Delta2, Delta1);
                    const expansion& z = expansion_sum(z1, Delta3);
                    Sign z_sign = z.sign();
                    if(z_sign != ZERO) {
                        return Sign(Delta3_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    Sign Delta1_sign = Delta1.sign();
                    if(Delta1_sign != ZERO) {
                        return Sign(Delta3_sign * Delta1_sign);
                    }
                } else if(p_sort[i] == p2) {
                    Sign Delta2_sign = Delta2.sign();
                    if(Delta2_sign != ZERO) {
                        return Sign(-Delta3_sign * Delta2_sign);
                    }
                } else if(p_sort[i] == p3) {
		    return NEGATIVE;
                } 
            }
        }
        return Sign(Delta3_sign * r_sign);
    }